

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O0

bool __thiscall Character::Equip(Character *this,short item,uchar subloc)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  EIF *pEVar8;
  World *pWVar9;
  int iVar10;
  reference pvVar11;
  uint *puVar12;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  EIF_Data *local_98;
  EIF_Data *weapon_eif;
  allocator<char> local_79;
  string local_78;
  string local_58;
  EIF_Data *local_38;
  EIF_Data *shield_eif;
  ECF_Data *ecf;
  EIF_Data *eif;
  uchar subloc_local;
  Character *pCStack_18;
  short item_local;
  Character *this_local;
  
  eif._5_1_ = subloc;
  eif._6_2_ = item;
  pCStack_18 = this;
  iVar10 = HasItem(this,item,false);
  if (iVar10 == 0) {
    this_local._7_1_ = false;
  }
  else {
    ecf = (ECF_Data *)EIF::Get(this->world->eif,(int)eif._6_2_);
    shield_eif = (EIF_Data *)ECF::Get(this->world->ecf,(uint)this->clas);
    iVar10._0_2_ = ecf->intl;
    iVar10._2_2_ = ecf->wis;
    if ((iVar10 == 0xc) && (ecf[1].name.field_2._M_local_buf[8] != this->gender)) {
      this_local._7_1_ = false;
    }
    else {
      iVar2._0_2_ = ecf->intl;
      iVar2._2_2_ = ecf->wis;
      if ((iVar2 == 10) &&
         ((iVar3._0_2_ = ecf->agi, iVar3._2_2_ = ecf->con, iVar3 == 4 &&
          (pvVar11 = std::array<int,_15UL>::operator[](&this->paperdoll,7), *pvVar11 != 0)))) {
        pEVar8 = this->world->eif;
        puVar12 = (uint *)std::array<int,_15UL>::operator[](&this->paperdoll,7);
        local_38 = EIF::Get(pEVar8,*puVar12);
        if ((ecf[1].name.field_2._M_local_buf[9] != '\0') ||
           ((local_38->subtype != Arrows && (local_38->subtype != Wings)))) {
          pWVar9 = this->world;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"two_handed_fail_1",&local_79);
          I18N::Format<>(&local_58,&pWVar9->i18n,&local_78);
          (*(this->super_Command_Source)._vptr_Command_Source[6])(this,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::~string((string *)&local_78);
          std::allocator<char>::~allocator(&local_79);
          return false;
        }
      }
      iVar4._0_2_ = ecf->intl;
      iVar4._2_2_ = ecf->wis;
      if ((iVar4 == 0xb) &&
         (pvVar11 = std::array<int,_15UL>::operator[](&this->paperdoll,8), *pvVar11 != 0)) {
        pEVar8 = this->world->eif;
        puVar12 = (uint *)std::array<int,_15UL>::operator[](&this->paperdoll,8);
        local_98 = EIF::Get(pEVar8,*puVar12);
        if ((local_98->subtype == TwoHanded) &&
           (((local_98->field_27).scrolly != '\0' ||
            ((iVar5._0_2_ = ecf->agi, iVar5._2_2_ = ecf->con, iVar5 != 2 &&
             (iVar6._0_2_ = ecf->agi, iVar6._2_2_ = ecf->con, iVar6 != 3)))))) {
          pWVar9 = this->world;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d8,"two_handed_fail_2",&local_d9);
          I18N::Format<>(&local_b8,&pWVar9->i18n,&local_d8);
          (*(this->super_Command_Source)._vptr_Command_Source[6])(this,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_d8);
          std::allocator<char>::~allocator(&local_d9);
          return false;
        }
      }
      if (((((short)(ushort)this->level < *(short *)((long)&ecf[1].name.field_2 + 10)) ||
           (((((ushort)this->clas != *(ushort *)((long)&ecf[1].name.field_2 + 0xc) &&
              ((ushort)(byte)shield_eif->graphic != *(ushort *)((long)&ecf[1].name.field_2 + 0xc)))
             || (*this->display_str < (int)*(short *)((long)&ecf[1].name.field_2 + 0xe))) ||
            ((sVar1._0_1_ = ecf[1].base, sVar1._1_1_ = ecf[1].type, *this->display_intl < (int)sVar1
             || (*this->display_wis < (int)ecf[1].str)))))) ||
          (*this->display_agi < (int)ecf[1].intl)) ||
         ((*this->display_con < (int)ecf[1].wis || (*this->display_cha < (int)ecf[1].agi)))) {
        this_local._7_1_ = false;
      }
      else {
        uVar7._0_2_ = ecf->intl;
        uVar7._2_2_ = ecf->wis;
        switch(uVar7) {
        case 10:
          this_local._7_1_ = character_equip_oneslot(this,eif._6_2_,eif._5_1_,Weapon);
          break;
        case 0xb:
          this_local._7_1_ = character_equip_oneslot(this,eif._6_2_,eif._5_1_,Shield);
          break;
        case 0xc:
          this_local._7_1_ = character_equip_oneslot(this,eif._6_2_,eif._5_1_,Armor);
          break;
        case 0xd:
          this_local._7_1_ = character_equip_oneslot(this,eif._6_2_,eif._5_1_,Hat);
          break;
        case 0xe:
          this_local._7_1_ = character_equip_oneslot(this,eif._6_2_,eif._5_1_,Boots);
          break;
        case 0xf:
          this_local._7_1_ = character_equip_oneslot(this,eif._6_2_,eif._5_1_,Gloves);
          break;
        case 0x10:
          this_local._7_1_ = character_equip_oneslot(this,eif._6_2_,eif._5_1_,Accessory);
          break;
        case 0x11:
          this_local._7_1_ = character_equip_oneslot(this,eif._6_2_,eif._5_1_,Belt);
          break;
        case 0x12:
          this_local._7_1_ = character_equip_oneslot(this,eif._6_2_,eif._5_1_,Necklace);
          break;
        case 0x13:
          this_local._7_1_ = character_equip_twoslot(this,eif._6_2_,eif._5_1_,Ring1,Ring2);
          break;
        case 0x14:
          this_local._7_1_ = character_equip_twoslot(this,eif._6_2_,eif._5_1_,Armlet1,Armlet2);
          break;
        case 0x15:
          this_local._7_1_ = character_equip_twoslot(this,eif._6_2_,eif._5_1_,Bracer1,Bracer2);
          break;
        default:
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Character::Equip(short item, unsigned char subloc)
{
	if (!this->HasItem(item))
	{
		return false;
	}

	const EIF_Data &eif = this->world->eif->Get(item);
	const ECF_Data &ecf = this->world->ecf->Get(this->clas);

	if (eif.type == EIF::Armor && eif.gender != this->gender)
	{
		return false;
	}

	if (eif.type == EIF::Weapon && eif.subtype == EIF::TwoHanded)
	{
		if (this->paperdoll[Shield])
		{
			const EIF_Data& shield_eif = this->world->eif->Get(this->paperdoll[Shield]);

			if (eif.dual_wield_dollgraphic || (shield_eif.subtype != EIF::Arrows && shield_eif.subtype != EIF::Wings))
			{
				this->StatusMsg(this->world->i18n.Format("two_handed_fail_1"));
				return false;
			}
		}
	}

	if (eif.type == EIF::Shield)
	{
		if (this->paperdoll[Weapon])
		{
			const EIF_Data& weapon_eif = this->world->eif->Get(this->paperdoll[Weapon]);

			if (weapon_eif.subtype == EIF::TwoHanded
			 && (weapon_eif.dual_wield_dollgraphic || (eif.subtype != EIF::Arrows && eif.subtype != EIF::Wings)))
			{
				this->StatusMsg(this->world->i18n.Format("two_handed_fail_2"));
				return false;
			}
		}
	}

	if (this->level < eif.levelreq || (this->clas != eif.classreq && ecf.base != eif.classreq)
	 || this->display_str < eif.strreq || this->display_intl < eif.intreq
	 || this->display_wis < eif.wisreq || this->display_agi < eif.agireq
	 || this->display_con < eif.conreq || this->display_cha < eif.chareq)
	{
		return false;
	}

	switch (eif.type)
	{
		case EIF::Weapon: return character_equip_oneslot(this, item, subloc, Weapon);
		case EIF::Shield: return character_equip_oneslot(this, item, subloc, Shield);
		case EIF::Hat: return character_equip_oneslot(this, item, subloc, Hat);
		case EIF::Boots: return character_equip_oneslot(this, item, subloc, Boots);
		case EIF::Gloves: return character_equip_oneslot(this, item, subloc, Gloves);
		case EIF::Accessory: return character_equip_oneslot(this, item, subloc, Accessory);
		case EIF::Belt: return character_equip_oneslot(this, item, subloc, Belt);
		case EIF::Armor: return character_equip_oneslot(this, item, subloc, Armor);
		case EIF::Necklace: return character_equip_oneslot(this, item, subloc, Necklace);
		case EIF::Ring: return character_equip_twoslot(this, item, subloc, Ring1, Ring2);
		case EIF::Armlet: return character_equip_twoslot(this, item, subloc, Armlet1, Armlet2);
		case EIF::Bracer: return character_equip_twoslot(this, item, subloc, Bracer1, Bracer2);
		default: return false;
	}
}